

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockContextProcessUndockWindow
               (ImGuiContext *ctx,ImGuiWindow *window,bool clear_persistent_docking_ref)

{
  byte *pbVar1;
  ImGuiDockNode *node;
  float save_dock_id;
  
  node = *(ImGuiDockNode **)&(ctx->IO).MouseDragMaxDistanceAbs[1].y;
  if (node == (ImGuiDockNode *)0x0) {
    (ctx->IO).MouseDragMaxDistanceAbs[3].y = 0.0;
  }
  else {
    save_dock_id = 0.0;
    if ((char)window == '\0') {
      save_dock_id = (ctx->IO).MouseDragMaxDistanceAbs[3].y;
    }
    DockNodeRemoveWindow(node,(ImGuiWindow *)ctx,(ImGuiID)save_dock_id);
  }
  *(undefined1 *)((long)&(ctx->IO).DisplayFramebufferScale.x + 2) = 0;
  pbVar1 = (byte *)((long)(ctx->IO).MouseDragMaxDistanceSqr + 0xe);
  *pbVar1 = *pbVar1 & 0xfc;
  if (GImGui->SettingsDirtyTimer <= 0.0) {
    GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
  }
  return;
}

Assistant:

void ImGui::DockContextProcessUndockWindow(ImGuiContext* ctx, ImGuiWindow* window, bool clear_persistent_docking_ref)
{
    IMGUI_DEBUG_LOG_DOCKING("DockContextProcessUndockWindow window '%s', clear_persistent_docking_ref = %d\n", window->Name, clear_persistent_docking_ref);
    IM_UNUSED(ctx);
    if (window->DockNode)
        DockNodeRemoveWindow(window->DockNode, window, clear_persistent_docking_ref ? 0 : window->DockId);
    else
        window->DockId = 0;
    window->Collapsed = false;
    window->DockIsActive = false;
    window->DockTabIsVisible = false;
    MarkIniSettingsDirty();
}